

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t pax_attribute_xattr(archive_entry *entry,char *name,char *value)

{
  char *s;
  int iVar1;
  size_t sVar2;
  size_t local_40;
  size_t value_len;
  void *value_decoded;
  char *name_decoded;
  char *value_local;
  char *name_local;
  archive_entry *entry_local;
  
  name_decoded = value;
  value_local = name;
  name_local = (char *)entry;
  sVar2 = strlen(name);
  if ((sVar2 < 0x12) || (iVar1 = memcmp(value_local,"LIBARCHIVE.xattr.",0x11), iVar1 != 0)) {
    return L'\x03';
  }
  value_local = value_local + 0x11;
  value_decoded = url_decode(value_local);
  s = name_decoded;
  if ((char *)value_decoded == (char *)0x0) {
    return L'\x02';
  }
  sVar2 = strlen(name_decoded);
  value_len = (size_t)base64_decode(s,sVar2,&local_40);
  if ((char *)value_len == (char *)0x0) {
    free(value_decoded);
    return L'\x01';
  }
  archive_entry_xattr_add_entry
            ((archive_entry *)name_local,(char *)value_decoded,(void *)value_len,local_40);
  free(value_decoded);
  free((void *)value_len);
  return L'\0';
}

Assistant:

static int
pax_attribute_xattr(struct archive_entry *entry,
	const char *name, const char *value)
{
	char *name_decoded;
	void *value_decoded;
	size_t value_len;

	if (strlen(name) < 18 || (memcmp(name, "LIBARCHIVE.xattr.", 17)) != 0)
		return 3;

	name += 17;

	/* URL-decode name */
	name_decoded = url_decode(name);
	if (name_decoded == NULL)
		return 2;

	/* Base-64 decode value */
	value_decoded = base64_decode(value, strlen(value), &value_len);
	if (value_decoded == NULL) {
		free(name_decoded);
		return 1;
	}

	archive_entry_xattr_add_entry(entry, name_decoded,
		value_decoded, value_len);

	free(name_decoded);
	free(value_decoded);
	return 0;
}